

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O3

bool __thiscall draco::CornerTable::ComputeOppositeCorners(CornerTable *this,int *num_vertices)

{
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar1;
  undefined8 uVar2;
  uint uVar3;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar4;
  pointer pIVar5;
  void *__s;
  int iVar6;
  pointer pIVar7;
  pointer piVar8;
  long lVar9;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  vector<int,_std::allocator<int>_> num_corners_on_vertices;
  vector<int,_std::allocator<int>_> vertex_offset;
  allocator_type local_bd;
  int local_bc;
  vector<int,_std::allocator<int>_> local_b8;
  void *local_98;
  void *local_90;
  CornerTable *local_88;
  pointer local_80;
  pointer local_78;
  long local_70;
  int *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if (num_vertices != (int *)0x0) {
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::resize(&(this->opposite_corners_).vector_,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (value_type *)&kInvalidCornerIndex);
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve
              (&local_b8,
               (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->corner_to_vertex_map_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
    pIVar5 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar7 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar13 = (long)pIVar7 - (long)pIVar5;
    if ((int)(uVar13 >> 2) != 0) {
      uVar11 = 0;
      piVar8 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        IVar10.value_ = pIVar5[uVar11].value_;
        if ((uint)((ulong)((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar8) >> 2) <=
            IVar10.value_) {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = 0;
          std::vector<int,_std::allocator<int>_>::resize
                    (&local_b8,(ulong)(IVar10.value_ + 1),(value_type_conflict1 *)&local_48);
          pIVar5 = (this->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pIVar7 = (this->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          piVar8 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        piVar8[IVar10.value_] = piVar8[IVar10.value_] + 1;
        uVar11 = uVar11 + 1;
        uVar13 = (long)pIVar7 - (long)pIVar5;
      } while (uVar11 < (uVar13 >> 2 & 0xffffffff));
    }
    uVar11 = (ulong)(int)(uVar13 >> 2);
    if (uVar11 >> 0x3c != 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    local_90 = (void *)0x0;
    __s = (void *)0x0;
    if ((uVar13 << 0x1e) >> 0x20 != 0) {
      __s = operator_new(uVar11 * 8);
      memset(__s,0xff,uVar11 * 8);
      local_90 = (void *)((long)__s + uVar11 * 8);
    }
    local_68 = num_vertices;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,
               (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_bd);
    num_vertices = local_68;
    local_70 = (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    local_98 = (void *)CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
    if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      iVar6 = 0;
      lVar9 = 0;
      do {
        *(int *)((long)local_98 + lVar9 * 4) = iVar6;
        iVar6 = iVar6 + local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9];
        lVar9 = lVar9 + 1;
      } while (local_70 + (ulong)(local_70 == 0) != lVar9);
    }
    pIVar5 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (ulong)((long)(this->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5) >> 2;
    if ((uint)local_50 != 0) {
      local_78 = (this->opposite_corners_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_bc = this->num_degenerated_faces_;
      local_60 = (long)__s + 4;
      local_80 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar17 = 0;
LAB_001465b6:
      uVar12 = uVar17 + 1;
      uVar3 = uVar17 - 2;
      if (0x55555555 < uVar12 * -0x55555555) {
        uVar3 = uVar12;
      }
      if (uVar3 == 0xffffffff) {
        IVar10.value_ = 0xffffffff;
      }
      else {
        IVar10.value_ = pIVar5[uVar3].value_;
      }
      uVar13 = (ulong)uVar17;
      IVar1.value_ = pIVar5[uVar13].value_;
      if (0x55555555 < uVar17 * -0x55555555) {
        IVar16.value_ = pIVar5[uVar17 - 1].value_;
LAB_00146633:
        iVar6 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[IVar16.value_];
        local_58 = uVar13;
        if (0 < iVar6) {
          lVar14 = (long)*(int *)((long)local_98 + (ulong)IVar16.value_ * 4);
          lVar9 = local_60 + lVar14 * 8;
          lVar18 = lVar14 << 0x20;
          lVar19 = 1;
          lVar15 = 0;
          do {
            uVar3 = *(uint *)(lVar9 + -4 + lVar15 * 8);
            if (uVar3 == 0xffffffff) break;
            if (uVar3 == IVar10.value_) {
              uVar3 = *(uint *)(lVar9 + lVar15 * 8);
              uVar11 = (ulong)uVar3;
              if (uVar11 == 0xffffffff) {
                IVar4.value_ = 0xffffffff;
              }
              else {
                IVar4.value_ = pIVar5[uVar11].value_;
              }
              if (IVar1.value_ != IVar4.value_) goto LAB_00146702;
            }
            lVar15 = lVar15 + 1;
            lVar18 = lVar18 + 0x100000000;
            lVar19 = lVar19 + 1;
          } while (iVar6 != (int)lVar15);
        }
        goto LAB_0014669f;
      }
      if (uVar17 + 2 == 0xffffffff) {
        IVar16.value_ = 0xffffffff;
      }
      else {
        IVar16.value_ = pIVar5[uVar17 + 2].value_;
      }
      if (((IVar1.value_ != IVar10.value_) && (IVar1.value_ != IVar16.value_)) &&
         (IVar10.value_ != IVar16.value_)) goto LAB_00146633;
      local_bc = local_bc + 1;
      this->num_degenerated_faces_ = local_bc;
      uVar12 = uVar17 + 3;
      goto LAB_0014674d;
    }
LAB_0014675a:
    *local_68 = (int)local_70;
    local_88 = this;
    if (local_98 != (void *)0x0) {
      operator_delete(local_98,(long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)local_98);
    }
    if (__s != (void *)0x0) {
      operator_delete(__s,(long)local_90 - (long)__s);
    }
    if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return num_vertices != (int *)0x0;
  while( true ) {
    uVar2 = *(undefined8 *)((long)__s + lVar19 * 8 + lVar14 * 8);
    *(undefined8 *)((long)__s + lVar19 * 8 + lVar14 * 8 + -8) = uVar2;
    lVar19 = lVar19 + 1;
    lVar18 = lVar9 + 0x100000000;
    if ((int)uVar2 == -1) break;
LAB_00146702:
    lVar9 = lVar18;
    if (iVar6 <= (int)lVar19) break;
  }
  *(undefined4 *)((long)__s + (lVar9 >> 0x1d)) = 0xffffffff;
  if (uVar3 == 0xffffffff) {
LAB_0014669f:
    if (0 < local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[IVar10.value_]) {
      iVar6 = *(int *)((long)local_98 + (ulong)IVar10.value_ * 4);
      lVar9 = 0;
      do {
        if (*(int *)((long)__s + lVar9 * 8 + (long)iVar6 * 8) == -1) {
          *(uint *)((long)__s + lVar9 * 8 + (long)iVar6 * 8) = IVar16.value_;
          *(uint *)((long)__s + lVar9 * 8 + (long)iVar6 * 8 + 4) = uVar17;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[IVar10.value_] != (int)lVar9);
    }
  }
  else {
    local_78[uVar13].value_ = uVar3;
    local_78[uVar11].value_ = uVar17;
  }
LAB_0014674d:
  uVar17 = uVar12;
  if ((uint)local_50 <= uVar12) goto LAB_0014675a;
  goto LAB_001465b6;
}

Assistant:

bool CornerTable::ComputeOppositeCorners(int *num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  if (num_vertices == nullptr) {
    return false;
  }
  opposite_corners_.resize(num_corners(), kInvalidCornerIndex);

  // Out implementation for finding opposite corners is based on keeping track
  // of outgoing half-edges for each vertex of the mesh. Half-edges (defined by
  // their opposite corners) are processed one by one and whenever a new
  // half-edge (corner) is processed, we check whether the sink vertex of
  // this half-edge contains its sibling half-edge. If yes, we connect them and
  // remove the sibling half-edge from the sink vertex, otherwise we add the new
  // half-edge to its source vertex.

  // First compute the number of outgoing half-edges (corners) attached to each
  // vertex.
  std::vector<int> num_corners_on_vertices;
  num_corners_on_vertices.reserve(num_corners());
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex v1 = Vertex(c);
    if (v1.value() >= static_cast<int>(num_corners_on_vertices.size())) {
      num_corners_on_vertices.resize(v1.value() + 1, 0);
    }
    // For each corner there is always exactly one outgoing half-edge attached
    // to its vertex.
    num_corners_on_vertices[v1.value()]++;
  }

  // Create a storage for half-edges on each vertex. We store all half-edges in
  // one array, where each entry is identified by the half-edge's sink vertex id
  // and the associated half-edge corner id (corner opposite to the half-edge).
  // Each vertex will be assigned storage for up to
  // |num_corners_on_vertices[vert_id]| half-edges. Unused half-edges are marked
  // with |sink_vert| == kInvalidVertexIndex.
  struct VertexEdgePair {
    VertexEdgePair()
        : sink_vert(kInvalidVertexIndex), edge_corner(kInvalidCornerIndex) {}
    VertexIndex sink_vert;
    CornerIndex edge_corner;
  };
  std::vector<VertexEdgePair> vertex_edges(num_corners(), VertexEdgePair());

  // For each vertex compute the offset (location where the first half-edge
  // entry of a given vertex is going to be stored). This way each vertex is
  // guaranteed to have a non-overlapping storage with respect to the other
  // vertices.
  std::vector<int> vertex_offset(num_corners_on_vertices.size());
  int offset = 0;
  for (size_t i = 0; i < num_corners_on_vertices.size(); ++i) {
    vertex_offset[i] = offset;
    offset += num_corners_on_vertices[i];
  }

  // Now go over the all half-edges (using their opposite corners) and either
  // insert them to the |vertex_edge| array or connect them with existing
  // half-edges.
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex tip_v = Vertex(c);
    const VertexIndex source_v = Vertex(Next(c));
    const VertexIndex sink_v = Vertex(Previous(c));

    const FaceIndex face_index = Face(c);
    if (c == FirstCorner(face_index)) {
      // Check whether the face is degenerated, if so ignore it.
      const VertexIndex v0 = Vertex(c);
      if (v0 == source_v || v0 == sink_v || source_v == sink_v) {
        ++num_degenerated_faces_;
        c += 2;  // Ignore the next two corners of the same face.
        continue;
      }
    }

    CornerIndex opposite_c(kInvalidCornerIndex);
    // The maximum number of half-edges attached to the sink vertex.
    const int num_corners_on_vert = num_corners_on_vertices[sink_v.value()];
    // Where to look for the first half-edge on the sink vertex.
    offset = vertex_offset[sink_v.value()];
    for (int i = 0; i < num_corners_on_vert; ++i, ++offset) {
      const VertexIndex other_v = vertex_edges[offset].sink_vert;
      if (other_v == kInvalidVertexIndex) {
        break;  // No matching half-edge found on the sink vertex.
      }
      if (other_v == source_v) {
        if (tip_v == Vertex(vertex_edges[offset].edge_corner)) {
          continue;  // Don't connect mirrored faces.
        }
        // A matching half-edge was found on the sink vertex. Mark the
        // half-edge's opposite corner.
        opposite_c = vertex_edges[offset].edge_corner;
        // Remove the half-edge from the sink vertex. We remap all subsequent
        // half-edges one slot down.
        // TODO(ostava): This can be optimized a little bit, by remapping only
        // the half-edge on the last valid slot into the deleted half-edge's
        // slot.
        for (int j = i + 1; j < num_corners_on_vert; ++j, ++offset) {
          vertex_edges[offset] = vertex_edges[offset + 1];
          if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
            break;  // Unused half-edge reached.
          }
        }
        // Mark the last entry as unused.
        vertex_edges[offset].sink_vert = kInvalidVertexIndex;
        break;
      }
    }
    if (opposite_c == kInvalidCornerIndex) {
      // No opposite corner found. Insert the new edge
      const int num_corners_on_source_vert =
          num_corners_on_vertices[source_v.value()];
      offset = vertex_offset[source_v.value()];
      for (int i = 0; i < num_corners_on_source_vert; ++i, ++offset) {
        // Find the first unused half-edge slot on the source vertex.
        if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
          vertex_edges[offset].sink_vert = sink_v;
          vertex_edges[offset].edge_corner = c;
          break;
        }
      }
    } else {
      // Opposite corner found.
      opposite_corners_[c] = opposite_c;
      opposite_corners_[opposite_c] = c;
    }
  }
  *num_vertices = static_cast<int>(num_corners_on_vertices.size());
  return true;
}